

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

uint duckdb_je_log_var_update_state(log_var_t *log_var)

{
  char cVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  char *__s1;
  size_t __n;
  bool bVar5;
  
  __s = log_var->name;
  sVar3 = strlen(__s);
  uVar4 = 1;
  if ((duckdb_je_log_init_done.repr & 1U) != 0) {
    __s1 = duckdb_je_log_var_names;
    do {
      for (__n = 0; (cVar1 = __s1[__n], cVar1 != '\0' && (cVar1 != '|')); __n = __n + 1) {
      }
      if ((__n == 1) && (*__s1 == '.')) {
LAB_01db3f8d:
        (log_var->state).repr = 2;
        uVar4 = 2;
LAB_01db3fc9:
        bVar5 = false;
      }
      else {
        if (sVar3 == __n) {
          iVar2 = strncmp(__s1,__s,__n);
          bVar5 = iVar2 == 0;
LAB_01db3f86:
          if (bVar5) goto LAB_01db3f8d;
        }
        else if (((long)__n < (long)sVar3) && (iVar2 = strncmp(__s1,__s,__n), iVar2 == 0)) {
          bVar5 = __s[__n] == '.';
          goto LAB_01db3f86;
        }
        if (cVar1 == '\0') {
          (log_var->state).repr = 1;
          uVar4 = 1;
          goto LAB_01db3fc9;
        }
        __s1 = __s1 + __n + 1;
        bVar5 = true;
      }
    } while (bVar5);
  }
  return uVar4;
}

Assistant:

unsigned
log_var_update_state(log_var_t *log_var) {
	const char *log_var_begin = log_var->name;
	const char *log_var_end = log_var->name + strlen(log_var->name);

	/* Pointer to one before the beginning of the current segment. */
	const char *segment_begin = log_var_names;

	/*
	 * If log_init done is false, we haven't parsed the malloc conf yet.  To
	 * avoid log-spew, we default to not displaying anything.
	 */
	if (!atomic_load_b(&log_init_done, ATOMIC_ACQUIRE)) {
		return LOG_INITIALIZED_NOT_ENABLED;
	}

	while (true) {
		const char *segment_end = log_var_extract_segment(
		    segment_begin);
		assert(segment_end < log_var_names + JEMALLOC_LOG_VAR_BUFSIZE);
		if (log_var_matches_segment(segment_begin, segment_end,
		    log_var_begin, log_var_end)) {
			atomic_store_u(&log_var->state, LOG_ENABLED,
			    ATOMIC_RELAXED);
			return LOG_ENABLED;
		}
		if (*segment_end == '\0') {
			/* Hit the end of the segment string with no match. */
			atomic_store_u(&log_var->state,
			    LOG_INITIALIZED_NOT_ENABLED, ATOMIC_RELAXED);
			return LOG_INITIALIZED_NOT_ENABLED;
		}
		/* Otherwise, skip the delimiter and continue. */
		segment_begin = segment_end + 1;
	}
}